

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfoCore<void*,void*>
               (SnapArrayInfo<void_*> *arrayInfo,JavascriptArray *arrayObj,InflateMap *inflator)

{
  Var newValue;
  void *jsVal;
  void *ttdVal;
  SnapArrayInfoBlock<void_*> *pSStack_28;
  uint32 i;
  SnapArrayInfoBlock<void_*> *dataBlock;
  InflateMap *inflator_local;
  JavascriptArray *arrayObj_local;
  SnapArrayInfo<void_*> *arrayInfo_local;
  
  for (pSStack_28 = arrayInfo->Data; pSStack_28 != (SnapArrayInfoBlock<void_*> *)0x0;
      pSStack_28 = pSStack_28->Next) {
    for (ttdVal._4_4_ = 0; ttdVal._4_4_ < pSStack_28->LastIndex - pSStack_28->FirstIndex;
        ttdVal._4_4_ = ttdVal._4_4_ + 1) {
      if (pSStack_28->ArrayValidTags[ttdVal._4_4_] != '\0') {
        newValue = SnapArrayInfo_InflateValue(pSStack_28->ArrayRangeContents[ttdVal._4_4_],inflator)
        ;
        Js::JavascriptArray::DirectSetItemAt<void*>
                  (arrayObj,ttdVal._4_4_ + pSStack_28->FirstIndex,newValue);
      }
    }
  }
  Js::JavascriptArray::SetLength(arrayObj,arrayInfo->Length);
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, Js::JavascriptArray* arrayObj, InflateMap* inflator)
        {
            const SnapArrayInfoBlock<T>* dataBlock = arrayInfo->Data;

            while(dataBlock != nullptr)
            {
                for(uint32 i = 0; i < (dataBlock->LastIndex - dataBlock->FirstIndex); ++i)
                {
                    if(dataBlock->ArrayValidTags[i])
                    {
                        T ttdVal = dataBlock->ArrayRangeContents[i];
                        U jsVal = SnapArrayInfo_InflateValue(ttdVal, inflator);

                        arrayObj->DirectSetItemAt<U>(i + dataBlock->FirstIndex, jsVal);
                    }
                }
                dataBlock = dataBlock->Next;
            }

            //Ensure this value is set correctly in case of sparse arrays
            arrayObj->SetLength(arrayInfo->Length);
        }